

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psintrp.c
# Opt level: O0

void cf2_doStems(CF2_Font font,CF2_Stack opStack,CF2_ArrStack stemHintArray,CF2_F16Dot16 *width,
                FT_Bool *haveWidth,CF2_F16Dot16 hintOffset)

{
  FT_UFast FVar1;
  CF2_F16Dot16 CVar2;
  CF2_F16Dot16 CVar3;
  int iVar4;
  undefined1 local_58 [4];
  int local_54;
  CF2_StemHintRec stemhint;
  CF2_F16Dot16 position;
  uint uStack_38;
  FT_Bool hasWidthArg;
  FT_UFast count;
  FT_UFast i;
  CF2_F16Dot16 hintOffset_local;
  FT_Bool *haveWidth_local;
  CF2_F16Dot16 *width_local;
  CF2_ArrStack stemHintArray_local;
  CF2_Stack opStack_local;
  CF2_Font font_local;
  
  FVar1 = cf2_stack_count(opStack);
  stemhint.maxDS._3_1_ = (byte)FVar1 & 1;
  stemhint.minDS = hintOffset;
  if (((font->isT1 == '\0') && ((FVar1 & 1) != 0)) && (*haveWidth == '\0')) {
    CVar2 = cf2_stack_getReal(opStack,0);
    CVar3 = cf2_getNominalWidthX(font->decoder);
    *width = CVar2 + CVar3;
  }
  if (font->decoder->width_only == '\0') {
    for (uStack_38 = (uint)(stemhint.maxDS._3_1_ != 0); CVar2 = stemhint.minDS, uStack_38 < FVar1;
        uStack_38 = uStack_38 + 2) {
      CVar3 = cf2_stack_getReal(opStack,uStack_38);
      iVar4 = CVar2 + CVar3;
      local_54 = iVar4;
      stemhint.minDS = iVar4;
      CVar2 = cf2_stack_getReal(opStack,uStack_38 + 1);
      stemhint._0_4_ = iVar4 + CVar2;
      local_58[0] = 0;
      stemhint.min = 0;
      stemhint.max = 0;
      stemhint.minDS = stemhint._0_4_;
      cf2_arrstack_push(stemHintArray,local_58);
    }
    cf2_stack_clear(opStack);
  }
  *haveWidth = '\x01';
  return;
}

Assistant:

static void
  cf2_doStems( const CF2_Font  font,
               CF2_Stack       opStack,
               CF2_ArrStack    stemHintArray,
               CF2_Fixed*      width,
               FT_Bool*        haveWidth,
               CF2_Fixed       hintOffset )
  {
    CF2_UInt  i;
    CF2_UInt  count       = cf2_stack_count( opStack );
    FT_Bool   hasWidthArg = (FT_Bool)( count & 1 );

    /* variable accumulates delta values from operand stack */
    CF2_Fixed  position = hintOffset;

    if ( font->isT1 && !font->decoder->flex_state && !*haveWidth )
      FT_ERROR(( "cf2_doStems (Type 1 mode):"
                 " No width. Use hsbw/sbw as first op\n" ));

    if ( !font->isT1 && hasWidthArg && !*haveWidth )
      *width = ADD_INT32( cf2_stack_getReal( opStack, 0 ),
                          cf2_getNominalWidthX( font->decoder ) );

    if ( font->decoder->width_only )
      goto exit;

    for ( i = hasWidthArg ? 1 : 0; i < count; i += 2 )
    {
      /* construct a CF2_StemHint and push it onto the list */
      CF2_StemHintRec  stemhint;


      stemhint.min =
      position     = ADD_INT32( position,
                                cf2_stack_getReal( opStack, i ) );
      stemhint.max =
      position     = ADD_INT32( position,
                                cf2_stack_getReal( opStack, i + 1 ) );

      stemhint.used  = FALSE;
      stemhint.maxDS =
      stemhint.minDS = 0;

      cf2_arrstack_push( stemHintArray, &stemhint ); /* defer error check */
    }

    cf2_stack_clear( opStack );

  exit:
    /* cf2_doStems must define a width (may be default) */
    *haveWidth = TRUE;
  }